

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O2

void __thiscall
txpackage_tests::package_validation_tests::test_method(package_validation_tests *this)

{
  long lVar1;
  CKey input_signing_key;
  CKey input_signing_key_00;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  unsigned_long uVar4;
  Chainstate *pCVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  CFeeRate *pCVar8;
  CAmount CVar9;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *pvVar10;
  int64_t iVar11;
  iterator iVar12;
  iterator pvVar13;
  PackageMempoolAcceptResult *client_maxfeerate;
  pointer ptVar14;
  iterator pvVar15;
  undefined ***pppuVar16;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *client_maxfeerate_00;
  char **ppcVar17;
  long lVar18;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  CTransactionRef input_transaction;
  CTransactionRef input_transaction_00;
  Wtxid *pWVar19;
  undefined4 in_stack_fffffffffffffa1c;
  undefined8 in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  CAmount in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa40;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  undefined4 local_544;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  assertion_result local_500;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  Package package_single_giant;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  CTransactionRef giant_ptx;
  char *local_468;
  unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> local_460;
  Init *local_458;
  SignalInterrupt *local_450;
  char *local_448;
  unique_ptr<CConnman,_std::default_delete<CConnman>_> local_440;
  char *local_438;
  unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> local_430;
  unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_428;
  unique_ptr<PeerManager,_std::default_delete<PeerManager>_> local_420;
  char *local_418;
  unique_ptr<BanMan,_std::default_delete<BanMan>_> local_410;
  char *local_408;
  pointer local_400;
  pointer local_3f8;
  pointer local_3f0;
  char *local_3e8;
  pointer local_3e0;
  char *local_3d8;
  pointer local_3d0;
  unique_ptr<interfaces::Mining,_std::default_delete<interfaces::Mining>_> local_3c8;
  WalletLoader *local_3c0;
  char *local_3b8;
  undefined1 local_3b0 [8];
  char *local_3a8;
  _Manager_type local_3a0;
  _Invoker_type local_398;
  unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_> local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  thread local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  Package package_parent_child;
  CTransactionRef tx_child;
  CKey local_2f0;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_2e0;
  CKey child_key;
  CTransactionRef tx_parent;
  CKey local_2b0;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_2a0;
  CKey parent_key;
  uint initialPoolSize;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  assertion_result local_268;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_single_large;
  PackageMempoolAcceptResult result_single_large;
  PackageMempoolAcceptResult result_parent_child;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_128;
  CMutableTransaction mtx_child;
  CScript child_locking_script;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_b0;
  CMutableTransaction mtx_parent;
  CScript parent_locking_script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock13,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
             ,0xcd,false);
  uVar4 = CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                           super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node
                           .mempool._M_t.
                           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  initialPoolSize = (uint)uVar4;
  GenerateRandomKey(SUB81(&parent_key,0));
  CKey::GetPubKey((CPubKey *)&result_single_large,&parent_key);
  PKHash::PKHash((PKHash *)&mtx_parent,(CPubKey *)&result_single_large);
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length._0_4_ =
       mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_;
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  result_parent_child.m_tx_results._M_t._M_impl._0_1_ = 2;
  GetScriptForDestination(&parent_locking_script,(CTxDestination *)&result_parent_child);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&result_parent_child);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2a0,
             &((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_2b0,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.coinbaseKey);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_b0,&parent_locking_script.super_CScriptBase);
  input_signing_key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key._0_8_ = &local_b0;
  auVar2._4_8_ = in_stack_fffffffffffffa20;
  auVar2._0_4_ = in_stack_fffffffffffffa1c;
  auVar2._12_8_ = in_stack_fffffffffffffa28;
  auVar2._20_8_ = in_stack_fffffffffffffa30;
  auVar2._28_4_ = 0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_2a0;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent,(TestChain100Setup *)this,input_transaction,0,(int)&local_2b0,
             input_signing_key,(CScript)(auVar2 << 0x20),in_stack_fffffffffffffa38,
             (bool)in_stack_fffffffffffffa40);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_b0);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_2b0.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a0._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_parent);
  GenerateRandomKey(SUB81(&child_key,0));
  CKey::GetPubKey((CPubKey *)&result_single_large,&child_key);
  PKHash::PKHash((PKHash *)&mtx_child,(CPubKey *)&result_single_large);
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length._0_4_ =
       mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_;
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  result_parent_child.m_tx_results._M_t._M_impl._0_1_ = 2;
  GetScriptForDestination(&child_locking_script,(CTxDestination *)&result_parent_child);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&result_parent_child);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2e0,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_2f0,&parent_key);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_128,&child_locking_script.super_CScriptBase);
  pWVar19 = (Wtxid *)0x11e1a3000;
  input_signing_key_00.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x11e1a3000;
  input_signing_key_00._0_8_ = &local_128;
  auVar3._4_8_ = in_stack_fffffffffffffa20;
  auVar3._0_4_ = in_stack_fffffffffffffa1c;
  auVar3._12_8_ = in_stack_fffffffffffffa28;
  auVar3._20_8_ = in_stack_fffffffffffffa30;
  auVar3._28_4_ = 0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_2e0;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_child,(TestChain100Setup *)this,input_transaction_00,0x65,(int)&local_2f0,
             input_signing_key_00,(CScript)(auVar3 << 0x20),in_stack_fffffffffffffa38,
             (bool)in_stack_fffffffffffffa40);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_128);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_2f0.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e0._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_child);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&result_parent_child,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &result_parent_child.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason._M_string_length,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 2;
  __l._M_array = (iterator)&result_parent_child;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_parent_child,__l,(allocator_type *)&result_single_large);
  lVar18 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&result_parent_child.m_state.super_ValidationState<PackageValidationResult>.
                       m_mode + lVar18));
    lVar18 = lVar18 + -0x10;
  } while (lVar18 != -8);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                      super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                      chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  client_maxfeerate = &result_single_large;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p._0_1_ = 0;
  ProcessNewPackage(&result_parent_child,pCVar5,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_parent_child,
                    true,(optional<CFeeRate> *)client_maxfeerate);
  pvVar13 = (iterator)0x0;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&result_single_large,&package_parent_child,&result_parent_child,true,
             (CTxMemPool *)0x0);
  if (result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
      field_2._M_local_buf[8] == '\x01') {
    local_328 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_320 = "";
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)client_maxfeerate;
    msg.m_begin = pvVar13;
    file.m_end = (iterator)0xe3;
    file.m_begin = (iterator)&local_328;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_338,msg);
    local_500._0_8_ = local_500._0_8_ & 0xffffffffffffff00;
    local_500.m_message.px = (element_type *)0x0;
    local_500.m_message.pn.pi_ = (sp_counted_base *)0x0;
    if (result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
        field_2._M_local_buf[8] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
      goto LAB_005463d7;
    }
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01139e30;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_348 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_340 = "";
    pvVar13 = &DAT_00000001;
    ptVar14 = (pointer)&DAT_00000001;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &result_single_large;
    boost::test_tools::tt_detail::report_assertion
              (&local_500,(lazy_ostream *)&err_single_large,1,1,WARN,(check_type)pWVar19,
               (size_t)&local_348,0xe3);
    boost::detail::shared_count::~shared_count(&local_500.m_message.pn);
  }
  else {
    cVar6 = std::
            _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            ::find(&result_parent_child.m_tx_results._M_t,
                   &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped);
    cVar7 = std::
            _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            ::find(&result_parent_child.m_tx_results._M_t,
                   &((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped);
    local_358 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_350 = "";
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    local_360 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)client_maxfeerate;
    msg_00.m_begin = pvVar13;
    file_00.m_end = (iterator)0xe8;
    file_00.m_begin = (iterator)&local_358;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_368,
               msg_00);
    pCVar8 = std::optional<CFeeRate>::value((optional<CFeeRate> *)&cVar6._M_node[6]._M_parent);
    iVar11 = GetVirtualTransactionSize
                       (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    CVar9 = CFeeRate::GetFee(pCVar8,(uint32_t)iVar11);
    local_500.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(CVar9 == 100000000);
    local_500.m_message.px = (element_type *)0x0;
    local_500.m_message.pn.pi_ = (sp_counted_base *)0x0;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &local_268;
    local_268._0_8_ =
         "it_parent->second.m_effective_feerate.value().GetFee(GetVirtualTransactionSize(*tx_parent)) == COIN"
    ;
    local_268.m_message.px = (element_type *)0xc6272c;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0113a070;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_378 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_370._M_id._M_thread =
         (id)((long)
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
             + 0x68);
    pvVar13 = &DAT_00000001;
    pvVar15 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_500,(lazy_ostream *)&err_single_large,1,0,WARN,(check_type)pWVar19,
               (size_t)&local_378,0xe8);
    boost::detail::shared_count::~shared_count(&local_500.m_message.pn);
    local_388 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_380 = "";
    local_398 = (_Invoker_type)&boost::unit_test::basic_cstring<char_const>::null;
    local_390._M_t.
    super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
    ._M_t.
    super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
    .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl =
         (__uniq_ptr_data<node::KernelNotifications,_std::default_delete<node::KernelNotifications>,_true,_true>
          )&boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar15;
    msg_01.m_begin = pvVar13;
    file_01.m_end = (iterator)0xe9;
    file_01.m_begin = (iterator)&local_388;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_398,
               msg_01);
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01139f30;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_3a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_3a0 = (_Manager_type)0xc61ecf;
    pvVar10 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)&cVar6._M_node[6]._M_right);
    local_500._0_8_ =
         (long)(pvVar10->
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(pvVar10->
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5;
    pppuVar16 = (undefined ***)&local_500;
    local_268._0_4_ = 1;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&err_single_large,&local_3a8,0xe9,1,2,pppuVar16,0xc6272d,&local_268,0xc69f21);
    local_3b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_3b0 = (undefined1  [8])0xc61ecf;
    local_3c8._M_t.
    super___uniq_ptr_impl<interfaces::Mining,_std::default_delete<interfaces::Mining>_>._M_t.
    super__Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>.
    super__Head_base<0UL,_interfaces::Mining_*,_false>._M_head_impl =
         (__uniq_ptr_data<interfaces::Mining,_std::default_delete<interfaces::Mining>,_true,_true>)
         &boost::unit_test::basic_cstring<char_const>::null;
    local_3c0 = (WalletLoader *)&boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = (iterator)pppuVar16;
    msg_02.m_begin = pvVar13;
    file_02.m_end = (iterator)0xea;
    file_02.m_begin = (iterator)&local_3b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3c8,
               msg_02);
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01139f30;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_3d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_3d0 = (pointer)0xc61ecf;
    pvVar10 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)&cVar6._M_node[6]._M_right);
    ptVar14 = (pvVar10->
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pWVar19 = &(tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_witness_hash;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
              (&err_single_large,&local_3d8,0xea,1,2,ptVar14,0xc62768,pWVar19,0xc627a4);
    local_3e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_3e0 = (pointer)0xc61ecf;
    local_3f8 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    local_3f0 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = (iterator)ptVar14;
    msg_03.m_begin = pvVar13;
    file_03.m_end = (iterator)0xec;
    file_03.m_begin = (iterator)&local_3e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3f8,
               msg_03);
    pCVar8 = std::optional<CFeeRate>::value((optional<CFeeRate> *)&cVar7._M_node[6]._M_parent);
    iVar11 = GetVirtualTransactionSize
                       (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    CVar9 = CFeeRate::GetFee(pCVar8,(uint32_t)iVar11);
    local_500.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(CVar9 == 100000000);
    local_500.m_message.px = (element_type *)0x0;
    local_500.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_268._0_8_ =
         "it_child->second.m_effective_feerate.value().GetFee(GetVirtualTransactionSize(*tx_child)) == COIN"
    ;
    local_268.m_message.px = (element_type *)0xc62821;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0113a070;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &local_268;
    local_408 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_400 = (pointer)0xc61ecf;
    pvVar13 = &DAT_00000001;
    pvVar15 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_500,(lazy_ostream *)&err_single_large,1,0,WARN,(check_type)pWVar19,
               (size_t)&local_408,0xec);
    boost::detail::shared_count::~shared_count(&local_500.m_message.pn);
    local_418 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_410._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
    super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
    super__Head_base<0UL,_BanMan_*,_false>._M_head_impl =
         (__uniq_ptr_data<BanMan,_std::default_delete<BanMan>,_true,_true>)
         ((long)
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
         + 0x68);
    local_428._M_t.
    super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>._M_t.
    super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
    super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
         (__uniq_ptr_data<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>,_true,_true>
          )&boost::unit_test::basic_cstring<char_const>::null;
    local_420._M_t.super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
    super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
    super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl =
         (__uniq_ptr_data<PeerManager,_std::default_delete<PeerManager>,_true,_true>)
         &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar15;
    msg_04.m_begin = pvVar13;
    file_04.m_end = (iterator)0xed;
    file_04.m_begin = (iterator)&local_418;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_428,
               msg_04);
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01139f30;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_438 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_430._M_t.
    super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>._M_t.
    super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
    super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_NetGroupManager,_std::default_delete<const_NetGroupManager>,_true,_true>
          )((long)
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
           + 0x68);
    pvVar10 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)&cVar7._M_node[6]._M_right);
    local_500._0_8_ =
         (long)(pvVar10->
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(pvVar10->
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5;
    pppuVar16 = (undefined ***)&local_500;
    local_268._0_4_ = 1;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&err_single_large,&local_438,0xed,1,2,pppuVar16,0xc62822,&local_268,0xc69f21);
    local_448 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_440._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
    super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
    super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
         (__uniq_ptr_data<CConnman,_std::default_delete<CConnman>,_true,_true>)
         ((long)
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
         + 0x68);
    local_458 = (Init *)&boost::unit_test::basic_cstring<char_const>::null;
    local_450 = (SignalInterrupt *)&boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = (iterator)pppuVar16;
    msg_05.m_begin = pvVar13;
    file_05.m_end = (iterator)0xee;
    file_05.m_begin = (iterator)&local_448;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_458,
               msg_05);
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01139f30;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_468 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_460._M_t.super___uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>._M_t.
    super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
    super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
         (__uniq_ptr_data<ECC_Context,_std::default_delete<ECC_Context>,_true,_true>)
         ((long)
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
         + 0x68);
    pvVar10 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)&cVar7._M_node[6]._M_right);
    ptVar14 = (pvVar10->
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pWVar19 = &(tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_witness_hash;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
              (&err_single_large,&local_468,0xee,1,2,ptVar14,0xc6285c,pWVar19,0xc62897);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&result_single_large);
  TxPackageTest::create_placeholder_tx((TxPackageTest *)&giant_ptx,(size_t)this,999);
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)ptVar14;
  msg_06.m_begin = pvVar13;
  file_06.m_end = (iterator)0xf2;
  file_06.m_begin = (iterator)&local_488;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_498,
             msg_06);
  iVar11 = GetVirtualTransactionSize
                     (giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x18a88 < iVar11;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = 0;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
  ._M_allocated_capacity = (size_type)&local_500;
  local_500._0_8_ = "GetVirtualTransactionSize(*giant_ptx) > DEFAULT_ANCESTOR_SIZE_LIMIT_KVB * 1000"
  ;
  local_500.m_message.px = (element_type *)0xc62900;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p._0_1_ = 0;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_0113a070;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4a0 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_single_large,(lazy_ostream *)&result_single_large,1,0,WARN,
             (check_type)pWVar19,(size_t)&local_4a8,0xf2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_single_large.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&result_single_large,
             &giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&result_single_large;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_single_giant,__l_00,(allocator_type *)&err_single_large);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &result_single_large.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                      super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                      chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  client_maxfeerate_00 = &err_single_large;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_single_large.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
  ProcessNewPackage(&result_single_large,pCVar5,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_single_giant,
                    true,(optional<CFeeRate> *)client_maxfeerate_00);
  pvVar13 = (iterator)0x0;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (&err_single_large,&package_single_giant,&result_single_large,false,(CTxMemPool *)0x0);
  if (err_single_large.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_4d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_4c8 = "";
    local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = (iterator)client_maxfeerate_00;
    msg_07.m_begin = pvVar13;
    file_07.m_end = (iterator)0xf6;
    file_07.m_begin = (iterator)&local_4d0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4e0,
               msg_07);
    local_268._0_8_ = local_268._0_8_ & 0xffffffffffffff00;
    local_268.m_message.px = (element_type *)0x0;
    local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
    if (err_single_large.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
      goto LAB_005463d7;
    }
    local_500.m_message.px = (element_type *)((ulong)local_500.m_message.px & 0xffffffffffffff00);
    local_500._0_8_ = &PTR__lazy_ostream_01139e30;
    local_500.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_510 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_508 = "";
    pvVar13 = &DAT_00000001;
    ppcVar17 = (char **)&DAT_00000001;
    local_4e8 = &err_single_large;
    boost::test_tools::tt_detail::report_assertion
              (&local_268,(lazy_ostream *)&local_500,1,1,WARN,(check_type)pWVar19,(size_t)&local_510
               ,0xf6);
    boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  }
  else {
    local_520 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_518 = "";
    local_530 = &boost::unit_test::basic_cstring<char_const>::null;
    local_528 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_08.m_end = (iterator)client_maxfeerate_00;
    msg_08.m_begin = pvVar13;
    file_08.m_end = (iterator)0xf8;
    file_08.m_begin = (iterator)&local_520;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_530,
               msg_08);
    local_500.m_message.px = (element_type *)((ulong)local_500.m_message.px & 0xffffffffffffff00);
    local_500._0_8_ = &PTR__lazy_ostream_01139f30;
    local_500.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_4e8 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0xc694e1;
    local_540 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_538 = "";
    ppcVar17 = (char **)&local_268;
    local_268._0_4_ =
         result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_result;
    local_544 = 2;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_500,&local_540,0xf8,1,2,ppcVar17,0xc62901,&local_544,0xc62929);
    local_558 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_550 = "";
    local_568 = &boost::unit_test::basic_cstring<char_const>::null;
    local_560 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = (iterator)ppcVar17;
    msg_09.m_begin = pvVar13;
    file_09.m_end = (iterator)0xf9;
    file_09.m_begin = (iterator)&local_558;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_568,
               msg_09);
    local_500.m_message.px = (element_type *)((ulong)local_500.m_message.px & 0xffffffffffffff00);
    local_500._0_8_ = &PTR__lazy_ostream_01139f30;
    local_500.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_4e8 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0xc694e1;
    local_578 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_570 = "";
    std::__cxx11::string::string
              ((string *)&local_268,
               &result_single_large.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason);
    pvVar13 = (iterator)0x2;
    ppcVar17 = (char **)&local_268;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
              (&local_500,&local_578,0xf9,1,2,ppcVar17,0xc6294a,"transaction failed",0xc62978);
    std::__cxx11::string::~string((string *)&local_268);
    iVar12 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&result_single_large.m_tx_results._M_t,
                    &((giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    local_588 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_580 = "";
    local_598 = &boost::unit_test::basic_cstring<char_const>::null;
    local_590 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_10.m_end = (iterator)ppcVar17;
    msg_10.m_begin = pvVar13;
    file_10.m_end = (iterator)0xfb;
    file_10.m_begin = (iterator)&local_588;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_598,
               msg_10);
    local_500.m_message.px = (element_type *)((ulong)local_500.m_message.px & 0xffffffffffffff00);
    local_500._0_8_ = &PTR__lazy_ostream_01139f30;
    local_500.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_4e8 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0xc694e1;
    local_5a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_5a0 = "";
    std::__cxx11::string::string
              ((string *)&local_268,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &iVar12._M_node[2]._M_left);
    pvVar13 = (iterator)0x2;
    ppcVar17 = (char **)&local_268;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (&local_500,&local_5a8,0xfb,1,2,ppcVar17,0xc6298d,"tx-size",0xc629bb);
    std::__cxx11::string::~string((string *)&local_268);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&err_single_large);
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5b0 = "";
  msg_11.m_end = (iterator)ppcVar17;
  msg_11.m_begin = pvVar13;
  file_11.m_end = (iterator)0xff;
  file_11.m_begin = (iterator)&local_5b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
             (size_t)&stack0xfffffffffffffa38,msg_11);
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_single_large.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01139f30;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_500._0_8_ =
       CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                        super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                        mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&err_single_large,&stack0xfffffffffffffa28,0xff,1,2,&local_500,0xc629c5,
             &initialPoolSize,0xc629dc);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&result_single_large);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_single_giant);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&result_parent_child);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_parent_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_child);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&child_locking_script.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&child_key.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&parent_locking_script.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&parent_key.keydata);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_005463d7:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_validation_tests)
{
    LOCK(cs_main);
    unsigned int initialPoolSize = m_node.mempool->size();

    // Parent and Child Package
    CKey parent_key = GenerateRandomKey();
    CScript parent_locking_script = GetScriptForDestination(PKHash(parent_key.GetPubKey()));
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/parent_locking_script,
                                                    /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
    CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);

    CKey child_key = GenerateRandomKey();
    CScript child_locking_script = GetScriptForDestination(PKHash(child_key.GetPubKey()));
    auto mtx_child = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent, /*input_vout=*/0,
                                                   /*input_height=*/101, /*input_signing_key=*/parent_key,
                                                   /*output_destination=*/child_locking_script,
                                                   /*output_amount=*/CAmount(48 * COIN), /*submit=*/false);
    CTransactionRef tx_child = MakeTransactionRef(mtx_child);
    Package package_parent_child{tx_parent, tx_child};
    const auto result_parent_child = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package_parent_child, /*test_accept=*/true, /*client_maxfeerate=*/{});
    if (auto err_parent_child{CheckPackageMempoolAcceptResult(package_parent_child, result_parent_child, /*expect_valid=*/true, nullptr)}) {
        BOOST_ERROR(err_parent_child.value());
    } else {
        auto it_parent = result_parent_child.m_tx_results.find(tx_parent->GetWitnessHash());
        auto it_child = result_parent_child.m_tx_results.find(tx_child->GetWitnessHash());

        BOOST_CHECK(it_parent->second.m_effective_feerate.value().GetFee(GetVirtualTransactionSize(*tx_parent)) == COIN);
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().front(), tx_parent->GetWitnessHash());

        BOOST_CHECK(it_child->second.m_effective_feerate.value().GetFee(GetVirtualTransactionSize(*tx_child)) == COIN);
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().front(), tx_child->GetWitnessHash());
    }
    // A single, giant transaction submitted through ProcessNewPackage fails on single tx policy.
    CTransactionRef giant_ptx = create_placeholder_tx(999, 999);
    BOOST_CHECK(GetVirtualTransactionSize(*giant_ptx) > DEFAULT_ANCESTOR_SIZE_LIMIT_KVB * 1000);
    Package package_single_giant{giant_ptx};
    auto result_single_large = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package_single_giant, /*test_accept=*/true, /*client_maxfeerate=*/{});
    if (auto err_single_large{CheckPackageMempoolAcceptResult(package_single_giant, result_single_large, /*expect_valid=*/false, nullptr)}) {
        BOOST_ERROR(err_single_large.value());
    } else {
        BOOST_CHECK_EQUAL(result_single_large.m_state.GetResult(), PackageValidationResult::PCKG_TX);
        BOOST_CHECK_EQUAL(result_single_large.m_state.GetRejectReason(), "transaction failed");
        auto it_giant_tx = result_single_large.m_tx_results.find(giant_ptx->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_giant_tx->second.m_state.GetRejectReason(), "tx-size");
    }

    // Check that mempool size hasn't changed.
    BOOST_CHECK_EQUAL(m_node.mempool->size(), initialPoolSize);
}